

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O3

int __thiscall
cs_impl::
cni_helper<int_(*)(const_cs_impl::path_cs_ext::path_info_&),_int_(*)(const_cs_impl::path_cs_ext::path_info_&)>
::_call<0>(cni_helper<int_(*)(const_cs_impl::path_cs_ext::path_info_&),_int_(*)(const_cs_impl::path_cs_ext::path_info_&)>
           *this,vector *args,sequence<0> *param_2)

{
  int iVar1;
  path_info *ppVar2;
  
  ppVar2 = try_convert_and_check<const_cs_impl::path_cs_ext::path_info_&,_const_cs_impl::path_cs_ext::path_info_&,_cs_impl::path_cs_ext::path_info,_0UL>
           ::convert((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_start);
  if ((this->mFunc).super__Function_base._M_manager != (_Manager_type)0x0) {
    iVar1 = (*(this->mFunc)._M_invoker)((_Any_data *)this,ppVar2);
    return iVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}